

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O0

void audio_make_sane(int *ndev,int *devvec,int *nchan,int *chanvec,int maxdev)

{
  int local_30;
  int i;
  int maxdev_local;
  int *chanvec_local;
  int *nchan_local;
  int *devvec_local;
  int *ndev_local;
  
  if (*ndev == -1) {
    if (*nchan == -1) {
      if (*ndev < 1) {
        *nchan = 0;
        *ndev = 0;
      }
      else {
        *nchan = 1;
        *chanvec = 2;
        *ndev = 1;
        *devvec = 0;
      }
    }
    else {
      for (local_30 = 0; local_30 < maxdev; local_30 = local_30 + 1) {
        devvec[local_30] = local_30;
      }
      *ndev = *nchan;
    }
  }
  else if (*nchan == -1) {
    *nchan = *ndev;
    for (local_30 = 0; local_30 < *ndev; local_30 = local_30 + 1) {
      chanvec[local_30] = 2;
    }
  }
  else if (*ndev < *nchan) {
    for (local_30 = *ndev; local_30 < *nchan; local_30 = local_30 + 1) {
      if (local_30 == 0) {
        *devvec = 0;
      }
      else {
        devvec[local_30] = devvec[local_30 + -1] + 1;
      }
    }
    *ndev = *nchan;
  }
  else if (*nchan < *ndev) {
    for (local_30 = *nchan; local_30 < *ndev; local_30 = local_30 + 1) {
      if (local_30 == 0) {
        *chanvec = 2;
      }
      else {
        chanvec[local_30] = chanvec[local_30 + -1];
      }
    }
    *ndev = *nchan;
  }
  for (local_30 = *ndev; local_30 < maxdev; local_30 = local_30 + 1) {
    devvec[local_30] = -1;
  }
  for (local_30 = *nchan; local_30 < maxdev; local_30 = local_30 + 1) {
    chanvec[local_30] = 0;
  }
  return;
}

Assistant:

static void audio_make_sane(int *ndev, int *devvec,
    int *nchan, int *chanvec, int maxdev)
{
    int i;
    if (*ndev == -1)
    {           /* no input audio devices specified */
        if (*nchan == -1)
        {
            if (*ndev >= 1)
            {
                *nchan=1;
                chanvec[0] = SYS_DEFAULTCH;
                *ndev = 1;
                devvec[0] = DEFAULTAUDIODEV;
            }
            else *ndev = *nchan = 0;
        }
        else
        {
            for (i = 0; i < maxdev; i++)
                devvec[i] = i;
            *ndev = *nchan;
        }
    }
    else
    {
        if (*nchan == -1)
        {
            *nchan = *ndev;
            for (i = 0; i < *ndev; i++)
                chanvec[i] = SYS_DEFAULTCH;
        }
        else if (*nchan > *ndev)
        {
            for (i = *ndev; i < *nchan; i++)
            {
                if (i == 0)
                    devvec[0] = DEFAULTAUDIODEV;
                else devvec[i] = devvec[i-1] + 1;
            }
            *ndev = *nchan;
        }
        else if (*nchan < *ndev)
        {
            for (i = *nchan; i < *ndev; i++)
            {
                if (i == 0)
                    chanvec[0] = SYS_DEFAULTCH;
                else chanvec[i] = chanvec[i-1];
            }
            *ndev = *nchan;
        }
    }
    for (i = *ndev; i < maxdev; i++)
        devvec[i] = -1;
    for (i = *nchan; i < maxdev; i++)
        chanvec[i] = 0;

}